

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_astDownCastNode_primitiveCompileIntoBytecode
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  anon_struct_24_3_7a3dbbfd gcFrame;
  sysbvm_stackFrameRecord_t local_38;
  undefined8 local_28;
  undefined1 *local_20;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  gcFrame.typeOperand = 0;
  gcFrame.valueOperand = 0;
  gcFrame.result = 0;
  local_38.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_38.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_38._12_4_ = 0;
  local_28 = 3;
  local_20 = (undefined1 *)&gcFrame;
  sysbvm_stackFrame_pushRecord(&local_38);
  gcFrame.typeOperand =
       sysbvm_functionBytecodeDirectCompiler_compileASTNode
                 (context,(sysbvm_functionBytecodeDirectCompiler_t *)arguments[1],
                  *(sysbvm_tuple_t *)(*arguments + 0x28));
  gcFrame.valueOperand =
       sysbvm_functionBytecodeDirectCompiler_compileASTNode
                 (context,(sysbvm_functionBytecodeDirectCompiler_t *)arguments[1],
                  *(sysbvm_tuple_t *)(*arguments + 0x30));
  gcFrame.result =
       sysbvm_functionBytecodeAssembler_newTemporary
                 (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),
                  *(sysbvm_tuple_t *)(*arguments + 0x20));
  if (*(long *)(*arguments + 0x38) == 0x1f) {
    sysbvm_functionBytecodeAssembler_uncheckedDownCastValue
              (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),gcFrame.result,
               gcFrame.typeOperand,gcFrame.valueOperand);
  }
  else {
    sysbvm_functionBytecodeAssembler_downCastValue
              (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),gcFrame.result,
               gcFrame.typeOperand,gcFrame.valueOperand);
  }
  sysbvm_stackFrame_popRecord(&local_38);
  return gcFrame.result;
}

Assistant:

static sysbvm_tuple_t sysbvm_astDownCastNode_primitiveCompileIntoBytecode(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_functionBytecodeDirectCompiler_t **compiler = (sysbvm_functionBytecodeDirectCompiler_t **)&arguments[1];

    sysbvm_astDownCastNode_t **downCastNode = (sysbvm_astDownCastNode_t**)node;
    struct {
        sysbvm_tuple_t typeOperand;
        sysbvm_tuple_t valueOperand;
        sysbvm_tuple_t result;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    gcFrame.typeOperand = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, (*downCastNode)->typeExpression);
    gcFrame.valueOperand = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, (*downCastNode)->valueExpression);
    gcFrame.result = sysbvm_functionBytecodeAssembler_newTemporary(context, (*compiler)->assembler, (*downCastNode)->super.analyzedType);
    if(sysbvm_tuple_boolean_decode((*downCastNode)->isUnchecked))
        sysbvm_functionBytecodeAssembler_uncheckedDownCastValue(context, (*compiler)->assembler, gcFrame.result, gcFrame.typeOperand, gcFrame.valueOperand);
    else
        sysbvm_functionBytecodeAssembler_downCastValue(context, (*compiler)->assembler, gcFrame.result, gcFrame.typeOperand, gcFrame.valueOperand);

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}